

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread.h
# Opt level: O2

int WaitForThread(THREAD_IDENTIFIER ThreadId)

{
  int iVar1;
  
  iVar1 = pthread_join(ThreadId,(void **)0x0);
  return (int)(iVar1 != 0);
}

Assistant:

inline int WaitForThread(THREAD_IDENTIFIER ThreadId)
{
#ifdef _WIN32
	// For Windows, there is no problem of detached or joinable state.
	// Anyway, all the resources used by the thread are released when
	// it is terminated and all the handles to it are closed. 
	// All attempts to open a handle to it after it is terminated will fail.
	// And while it is not terminated, we can wait for it with WaitForSingleObject(). 
#ifndef WINCE
	HANDLE hThread = OpenThread(THREAD_ALL_ACCESS, TRUE, ThreadId);

	// Should check GetLastError() to see if there is a permission problem...

	// Here we do not know if it failed because the thread has already terminated 
	// or there was another problem...
	if (hThread == NULL)
	{
		PRINT_DEBUG_WARNING_OSTHREAD(("WaitForThread warning (%s) : %s"
			"(ThreadId=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			ThreadId));
	}
	else
	{ 
		// The thread is not already terminated.
		// Wait until the thread has terminated.
		if (WaitForSingleObject(hThread, INFINITE) == WAIT_FAILED)
		{
			PRINT_DEBUG_ERROR_OSTHREAD(("WaitForThread error (%s) : %s"
				"(ThreadId=%#x)\n", 
				strtime_m(), 
				GetLastErrorMsg(), 
				ThreadId));
			CloseHandle(hThread);
			return EXIT_FAILURE;
		}

		// Close the thread handle.
		if (!CloseHandle(hThread))
		{
			PRINT_DEBUG_ERROR_OSTHREAD(("WaitForThread error (%s) : %s"
				"(ThreadId=%#x)\n", 
				strtime_m(), 
				GetLastErrorMsg(), 
				ThreadId));
			return EXIT_FAILURE;
		}
	}
#else
	// For WINCE, the thread identifier is the handle of the thread.
	HANDLE hThread = (HANDLE)ThreadId;

	// Should check GetLastError() to see if there is a permission problem...

	// Here we do not know if it failed because the thread has already terminated 
	// or there was another problem...
	if (WaitForSingleObject(hThread, INFINITE) == WAIT_FAILED)
	{
		PRINT_DEBUG_WARNING_OSTHREAD(("WaitForThread warning (%s) : %s"
			"(ThreadId=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			ThreadId));
	}
#endif // !WINCE
#else 
	// Wait until the thread has terminated.
	// Note : pthread_join() may fail if the thread identifier is bad. This can be because 
	// it was an invalid thread identifier or the thread has already terminated but this would mean that 
	// pthread_detach() or pthread_join() have already been called successfully...
	if (pthread_join(ThreadId, NULL) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("WaitForThread error (%s) : %s"
			"(ThreadId=%#x)\n", 
			strtime_m(), 
			"pthread_join failed. ", 
			ThreadId));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	return EXIT_SUCCESS;
}